

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O3

void VP8DefaultProbas(VP8Encoder *enc)

{
  (enc->proba).use_skip_proba = 0;
  (enc->proba).segments[0] = 0xff;
  (enc->proba).segments[1] = 0xff;
  (enc->proba).segments[2] = 0xff;
  memcpy((enc->proba).coeffs,VP8CoeffsProba0,0x420);
  (enc->proba).dirty = 1;
  return;
}

Assistant:

void VP8DefaultProbas(VP8Encoder* const enc) {
  VP8EncProba* const probas = &enc->proba;
  probas->use_skip_proba = 0;
  memset(probas->segments, 255u, sizeof(probas->segments));
  memcpy(probas->coeffs, VP8CoeffsProba0, sizeof(VP8CoeffsProba0));
  // Note: we could hard-code the level_costs corresponding to VP8CoeffsProba0,
  // but that's ~11k of static data. Better call VP8CalculateLevelCosts() later.
  probas->dirty = 1;
}